

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QGenericArrayOps<QTextEdit::ExtraSelection>::moveAppend
          (QGenericArrayOps<QTextEdit::ExtraSelection> *this,ExtraSelection *b,ExtraSelection *e)

{
  ExtraSelection *this_00;
  ulong in_RDX;
  ulong in_RSI;
  ExtraSelection *in_RDI;
  ExtraSelection *data;
  ulong local_10;
  
  if (in_RSI != in_RDX) {
    this_00 = QArrayDataPointer<QTextEdit::ExtraSelection>::begin
                        ((QArrayDataPointer<QTextEdit::ExtraSelection> *)0x72fc97);
    local_10 = in_RSI;
    while (local_10 < in_RDX) {
      QTextEdit::ExtraSelection::ExtraSelection(this_00,in_RDI);
      local_10 = local_10 + 0x18;
      *(long *)&(in_RDI->format).field_0x8 = *(long *)&(in_RDI->format).field_0x8 + 1;
    }
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }